

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer_TwoLevelShm_Async.cpp
# Opt level: O1

void adios2::core::engine::BP5Writer::AsyncWriteThread_TwoLevelShm_SendDataToAggregator
               (MPIShmChain *a,BufferV *Data)

{
  ShmDataBuffer *pSVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> DataVec;
  void *local_48;
  long local_40;
  
  (*Data->_vptr_BufferV[2])(&local_48);
  uVar5 = local_40 - (long)local_48 >> 4;
  uVar4 = 0;
  uVar3 = 0;
  while (uVar3 < uVar5) {
    pSVar1 = aggregator::MPIShmChain::LockProducerBuffer(a);
    pSVar1->actual_size = 0;
    do {
      lVar6 = uVar3 * 0x10;
      uVar2 = *(long *)((long)local_48 + lVar6 + 8) - uVar4;
      uVar7 = pSVar1->max_size - pSVar1->actual_size;
      if (uVar2 < uVar7) {
        uVar7 = uVar2;
      }
      memcpy(pSVar1->buf + pSVar1->actual_size,(void *)(*(long *)((long)local_48 + lVar6) + uVar4),
             uVar7);
      uVar2 = pSVar1->actual_size + uVar7;
      pSVar1->actual_size = uVar2;
      uVar7 = uVar7 + uVar4;
      bVar8 = uVar7 < *(ulong *)((long)local_48 + lVar6 + 8);
      uVar4 = 0;
      if (bVar8) {
        uVar4 = uVar7;
      }
      uVar3 = (uVar3 + 1) - (ulong)bVar8;
    } while ((uVar2 < pSVar1->max_size) && (uVar3 < uVar5));
    aggregator::MPIShmChain::UnlockProducerBuffer(a);
  }
  if (local_48 != (void *)0x0) {
    operator_delete(local_48);
  }
  return;
}

Assistant:

void BP5Writer::AsyncWriteThread_TwoLevelShm_SendDataToAggregator(aggregator::MPIShmChain *a,
                                                                  format::BufferV *Data)
{
    /* In a loop, copy the local data into the shared memory, alternating
       between the two segments.
    */

    std::vector<core::iovec> DataVec = Data->DataVec();
    size_t nBlocks = DataVec.size();

    // size_t sent = 0;
    size_t block = 0;
    size_t temp_offset = 0;
    while (block < nBlocks)
    {
        // potentially blocking call waiting on Aggregator
        aggregator::MPIShmChain::ShmDataBuffer *b = a->LockProducerBuffer();
        // b->max_size: how much we can copy
        // b->actual_size: how much we actually copy
        b->actual_size = 0;
        while (true)
        {
            /* Copy n bytes from the current block, current offset to shm
                making sure to use up to shm_size bytes
            */
            size_t n = DataVec[block].iov_len - temp_offset;
            if (n > (b->max_size - b->actual_size))
            {
                n = b->max_size - b->actual_size;
            }
            std::memcpy(&b->buf[b->actual_size],
                        (const char *)DataVec[block].iov_base + temp_offset, n);
            b->actual_size += n;

            /* Have we processed the entire block or staying with it? */
            if (n + temp_offset < DataVec[block].iov_len)
            {
                temp_offset += n;
            }
            else
            {
                temp_offset = 0;
                ++block;
            }

            /* Have we reached the max allowed shm size ?*/
            if (b->actual_size >= b->max_size)
            {
                break;
            }
            if (block >= nBlocks)
            {
                break;
            }
        }
        // sent += b->actual_size;
        a->UnlockProducerBuffer();
    }
}